

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void mqc_renorme(opj_mqc_t *mqc)

{
  uint *puVar1;
  uint uVar2;
  
  uVar2 = mqc->a;
  do {
    uVar2 = uVar2 * 2;
    mqc->a = uVar2;
    mqc->c = mqc->c << 1;
    puVar1 = &mqc->ct;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      mqc_byteout(mqc);
      uVar2 = mqc->a;
    }
  } while (-1 < (short)uVar2);
  return;
}

Assistant:

static void mqc_renorme(opj_mqc_t *mqc) {
	do {
		mqc->a <<= 1;
		mqc->c <<= 1;
		mqc->ct--;
		if (mqc->ct == 0) {
			mqc_byteout(mqc);
		}
	} while ((mqc->a & 0x8000) == 0);
}